

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O2

void __thiscall Fl_Widget::damage(Fl_Widget *this,uchar fl)

{
  long lVar1;
  
  if (this->type_ < 0xf0) {
    damage(this,fl,this->x_,this->y_,this->w_,this->h_);
    return;
  }
  lVar1 = *(long *)&this[1].w_;
  if (lVar1 != 0) {
    if (*(long *)(lVar1 + 0x18) != 0) {
      XDestroyRegion();
      *(undefined8 *)(lVar1 + 0x18) = 0;
    }
    this->damage_ = this->damage_ | fl;
    Fl::damage_ = 1;
  }
  return;
}

Assistant:

void Fl_Widget::damage(uchar fl) {
  if (type() < FL_WINDOW) {
    // damage only the rectangle covered by a child widget:
    damage(fl, x(), y(), w(), h());
  } else {
    // damage entire window by deleting the region:
    Fl_X* i = Fl_X::i((Fl_Window*)this);
    if (!i) return; // window not mapped, so ignore it
    if (i->region) {XDestroyRegion(i->region); i->region = 0;}
    damage_ |= fl;
    Fl::damage(FL_DAMAGE_CHILD);
  }
}